

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

string * __thiscall
wabt::Decompiler::Decompile_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this)

{
  Func *f_00;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  undefined4 uVar1;
  Table *args;
  Global *args_00;
  bool bVar2;
  Index IVar3;
  Type t_00;
  vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_> *this_00;
  reference ppMVar4;
  vector<wabt::Global_*,_std::allocator<wabt::Global_*>_> *this_01;
  reference ppGVar5;
  vector<wabt::Table_*,_std::allocator<wabt::Table_*>_> *this_02;
  reference ppTVar6;
  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *this_03;
  reference ppDVar7;
  string *args_01;
  ulong uVar8;
  vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *this_04;
  reference ppFVar9;
  reference pvVar10;
  char *pcVar11;
  reference pbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  char **ppcVar13;
  Index index;
  char (*args_2) [2];
  char (*in_stack_fffffffffffffa98) [5];
  size_t amount;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stat;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  undefined1 local_4c8 [8];
  Value val;
  uint local_4a0;
  Index i_1;
  string local_490;
  undefined4 local_46c;
  string local_468;
  string local_448;
  undefined1 local_428 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  Type t;
  Index i;
  undefined1 local_3e0 [8];
  AST ast;
  size_type local_310;
  bool is_import_3;
  Func *f;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *__range2_4;
  undefined1 local_2d8 [4];
  Index func_index;
  string ds;
  string local_298;
  DataSegment *local_278;
  DataSegment *dat;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *__range2_3;
  string local_238;
  string local_218;
  Enum local_1f4;
  char *local_1f0;
  string local_1e8;
  string_view local_1c8;
  byte local_1b1;
  Table *pTStack_1b0;
  bool is_import_2;
  Table *tab;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<wabt::Table_*,_std::allocator<wabt::Table_*>_> *__range2_2;
  undefined1 local_188 [4];
  Index table_index;
  string local_168;
  Enum local_144;
  char *local_140;
  string local_138;
  string_view local_118;
  byte local_101;
  Global *pGStack_100;
  bool is_import_1;
  Global *g;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<wabt::Global_*,_std::allocator<wabt::Global_*>_> *__range2_1;
  undefined1 local_d8 [4];
  Index global_index;
  string local_b8;
  string local_98;
  string local_78;
  string_view local_58;
  byte local_41;
  Memory *pMStack_40;
  bool is_import;
  Memory *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_> *__range2;
  Index memory_index;
  Decompiler *this_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __range2._0_4_ = 0;
  this_00 = &((this->mc).module)->memories;
  __end2 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::begin(this_00);
  m = (Memory *)std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wabt::Memory_*const_*,_std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>_>
                                     *)&m), bVar2) {
    ppMVar4 = __gnu_cxx::
              __normal_iterator<wabt::Memory_*const_*,_std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>_>
              ::operator*(&__end2);
    pMStack_40 = *ppMVar4;
    string_view::string_view(&local_58,&pMStack_40->name);
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(uint)__range2;
    local_41 = CheckImportExport(this,__return_storage_ptr__,Memory,(uint)__range2,local_58);
    cat<char[8],std::__cxx11::string>(&local_78,(wabt *)"memory ",(char (*) [8])pMStack_40,args_1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if ((local_41 & 1) == 0) {
      std::__cxx11::to_string(&local_b8,(pMStack_40->page_limits).initial);
      std::__cxx11::to_string((string *)local_d8,(pMStack_40->page_limits).max);
      cat<char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                (&local_98,(wabt *)"(initial: ",(char (*) [11])&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                 (char (*) [8])local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f921b,
                 (char (*) [2])in_stack_fffffffffffffa98);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";\n");
    __range2._0_4_ = (uint)__range2 + 1;
    __gnu_cxx::
    __normal_iterator<wabt::Memory_*const_*,_std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>_>
    ::operator++(&__end2);
  }
  bVar2 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::empty
                    (&((this->mc).module)->memories);
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  }
  __range2_1._4_4_ = 0;
  this_01 = &((this->mc).module)->globals;
  __end2_1 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::begin(this_01);
  g = (Global *)std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::end(this_01);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<wabt::Global_*const_*,_std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>_>
                             *)&g), bVar2) {
    ppGVar5 = __gnu_cxx::
              __normal_iterator<wabt::Global_*const_*,_std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>_>
              ::operator*(&__end2_1);
    pGStack_100 = *ppGVar5;
    string_view::string_view(&local_118,&pGStack_100->name);
    name_02.size_ = local_118.size_;
    name_02.data_ = local_118.data_;
    ppcVar13 = (char **)local_118.size_;
    local_101 = CheckImportExport(this,__return_storage_ptr__,Global,__range2_1._4_4_,name_02);
    args_00 = pGStack_100;
    local_144 = (pGStack_100->type).enum_;
    local_140 = GetDecompTypeName((Type)local_144);
    pcVar11 = ":";
    cat<char[8],std::__cxx11::string,char[2],char_const*>
              (&local_138,(wabt *)"global ",(char (*) [8])args_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
               (char (*) [2])&local_140,ppcVar13);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    if ((local_101 & 1) == 0) {
      InitExp_abi_cxx11_((string *)local_188,this,&pGStack_100->init_expr);
      cat<char[4],std::__cxx11::string>
                (&local_168,(wabt *)0x2ecb8d,(char (*) [4])local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar11);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)local_188);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";\n");
    __range2_1._4_4_ = __range2_1._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<wabt::Global_*const_*,_std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>_>
    ::operator++(&__end2_1);
  }
  bVar2 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::empty
                    (&((this->mc).module)->globals);
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  }
  __range2_2._4_4_ = 0;
  this_02 = &((this->mc).module)->tables;
  __end2_2 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::begin(this_02);
  tab = (Table *)std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::end(this_02);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<wabt::Table_*const_*,_std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>_>
                             *)&tab), bVar2) {
    ppTVar6 = __gnu_cxx::
              __normal_iterator<wabt::Table_*const_*,_std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>_>
              ::operator*(&__end2_2);
    pTStack_1b0 = *ppTVar6;
    string_view::string_view(&local_1c8,&pTStack_1b0->name);
    name_01.size_ = local_1c8.size_;
    name_01.data_ = local_1c8.data_;
    ppcVar13 = (char **)local_1c8.size_;
    local_1b1 = CheckImportExport(this,__return_storage_ptr__,Table,__range2_2._4_4_,name_01);
    args = pTStack_1b0;
    local_1f4 = (pTStack_1b0->elem_type).enum_;
    local_1f0 = GetDecompTypeName((Type)local_1f4);
    cat<char[7],std::__cxx11::string,char[2],char_const*>
              (&local_1e8,(wabt *)"table ",(char (*) [7])args,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
               (char (*) [2])&local_1f0,ppcVar13);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    if ((local_1b1 & 1) == 0) {
      std::__cxx11::to_string(&local_238,(pTStack_1b0->elem_limits).initial);
      std::__cxx11::to_string((string *)&__range2_3,(pTStack_1b0->elem_limits).max);
      cat<char[7],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                (&local_218,(wabt *)"(min: ",(char (*) [7])&local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                 (char (*) [8])&__range2_3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f921b,
                 (char (*) [2])in_stack_fffffffffffffa98);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&__range2_3);
      std::__cxx11::string::~string((string *)&local_238);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";\n");
    __range2_2._4_4_ = __range2_2._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<wabt::Table_*const_*,_std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>_>
    ::operator++(&__end2_2);
  }
  bVar2 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::empty
                    (&((this->mc).module)->tables);
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  }
  this_03 = &((this->mc).module)->data_segments;
  __end2_3 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::begin(this_03);
  dat = (DataSegment *)
        std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::end(this_03);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_3,
                            (__normal_iterator<wabt::DataSegment_*const_*,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
                             *)&dat), bVar2) {
    ppDVar7 = __gnu_cxx::
              __normal_iterator<wabt::DataSegment_*const_*,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
              ::operator*(&__end2_3);
    local_278 = *ppDVar7;
    args_01 = &local_278->name;
    InitExp_abi_cxx11_((string *)((long)&ds.field_2 + 8),this,&local_278->offset);
    cat<char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[5]>
              (&local_298,(wabt *)"data ",(char (*) [6])args_01,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(offset: ",
               (char (*) [10])((long)&ds.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") = ",
               in_stack_fffffffffffffa98);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)(ds.field_2._M_local_buf + 8));
    BinaryToString_abi_cxx11_((string *)local_2d8,this,&local_278->data);
    uVar8 = std::__cxx11::string::size();
    if (this->target_exp_width >> 1 < uVar8) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_2d8);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";\n");
    std::__cxx11::string::~string((string *)local_2d8);
    __gnu_cxx::
    __normal_iterator<wabt::DataSegment_*const_*,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
    ::operator++(&__end2_3);
  }
  bVar2 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::empty
                    (&((this->mc).module)->data_segments);
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  }
  __range2_4._4_4_ = 0;
  this_04 = &((this->mc).module)->funcs;
  __end2_4 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::begin(this_04);
  f = (Func *)std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::end(this_04);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2_4,
                            (__normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
                             *)&f), bVar2) {
    ppFVar9 = __gnu_cxx::
              __normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
              ::operator*(&__end2_4);
    f_00 = *ppFVar9;
    this->cur_func = f_00;
    string_view::string_view
              ((string_view *)
               &ast.blocks_closed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage,&f_00->name);
    name_00.size_ = local_310;
    name_00.data_ =
         (char *)ast.blocks_closed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage;
    args_2 = (char (*) [2])
             ast.blocks_closed.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_end_of_storage;
    bVar2 = CheckImportExport(this,__return_storage_ptr__,First,__range2_4._4_4_,name_00);
    AST::AST((AST *)local_3e0,&this->mc,f_00);
    this->cur_ast = (AST *)local_3e0;
    if (!bVar2) {
      IVar3 = Func::GetNumResults(f_00);
      AST::Construct((AST *)local_3e0,&f_00->exprs,IVar3,true);
      pvVar10 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[]
                          ((vector<wabt::Node,_std::allocator<wabt::Node>_> *)&ast,0);
      LoadStoreTracking::Track(&this->lst,pvVar10);
      LoadStoreTracking::CheckLayouts(&this->lst);
    }
    cat<char[10],std::__cxx11::string,char[2]>
              ((string *)&t,(wabt *)"function ",(char (*) [10])f_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2ed5cb,args_2)
    ;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&t);
    std::__cxx11::string::~string((string *)&t);
    name.field_2._12_4_ = 0;
    while( true ) {
      uVar1 = name.field_2._12_4_;
      IVar3 = Func::GetNumParams(f_00);
      ppcVar13 = (char **)(ulong)IVar3;
      if (IVar3 <= (uint)uVar1) break;
      if (name.field_2._12_4_ != 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      }
      name.field_2._8_4_ = Func::GetParamType(f_00,name.field_2._12_4_);
      IndexToAlphaName_abi_cxx11_(&local_448,(wabt *)(ulong)(uint)name.field_2._12_4_,index);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428,
                     "$",&local_448);
      std::__cxx11::string::~string((string *)&local_448);
      local_46c = name.field_2._8_4_;
      LocalDecl(&local_468,this,(string *)local_428,(Type)name.field_2._8_4_);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_468);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)local_428);
      name.field_2._12_4_ = name.field_2._12_4_ + 1;
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
    IVar3 = Func::GetNumResults(f_00);
    if (IVar3 != 0) {
      IVar3 = Func::GetNumResults(f_00);
      if (IVar3 == 1) {
        t_00 = Func::GetResultType(f_00,0);
        _i_1 = GetDecompTypeName(t_00);
        cat<char[2],char_const*>(&local_490,(wabt *)":",(char (*) [2])&i_1,ppcVar13);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_490);
        std::__cxx11::string::~string((string *)&local_490);
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,":(");
        for (local_4a0 = 0; IVar3 = Func::GetNumResults(f_00), local_4a0 < IVar3;
            local_4a0 = local_4a0 + 1) {
          if (local_4a0 != 0) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
          }
          val._28_4_ = Func::GetResultType(f_00,local_4a0);
          pcVar11 = GetDecompTypeName((Type)val._28_4_);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar11);
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
      }
    }
    if (bVar2) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";");
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," {\n");
      pvVar10 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[]
                          ((vector<wabt::Node,_std::allocator<wabt::Node>_> *)&ast,0);
      DecompileExpr((Value *)local_4c8,this,pvVar10,(Node *)0x0);
      amount = this->indent_amount;
      string_view::string_view((string_view *)&__range4);
      IndentValue(this,(Value *)local_4c8,amount,___range4);
      __end4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_4c8);
      stat = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_4c8);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&stat), bVar2) {
        pbVar12 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end4);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pbVar12);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end4);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
      Value::~Value((Value *)local_4c8);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n\n");
    ModuleContext::EndFunc(&this->mc);
    LoadStoreTracking::Clear(&this->lst);
    __range2_4._4_4_ = __range2_4._4_4_ + 1;
    this->cur_ast = (AST *)0x0;
    this->cur_func = (Func *)0x0;
    AST::~AST((AST *)local_3e0);
    __gnu_cxx::
    __normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
    ::operator++(&__end2_4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Decompile() {
    std::string s;
    // Memories.
    Index memory_index = 0;
    for (auto m : mc.module.memories) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Memory, memory_index, m->name);
      s += cat("memory ", m->name);
      if (!is_import) {
        s += cat("(initial: ", std::to_string(m->page_limits.initial),
                 ", max: ", std::to_string(m->page_limits.max), ")");
      }
      s += ";\n";
      memory_index++;
    }
    if (!mc.module.memories.empty())
      s += "\n";

    // Globals.
    Index global_index = 0;
    for (auto g : mc.module.globals) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Global, global_index, g->name);
      s += cat("global ", g->name, ":", GetDecompTypeName(g->type));
      if (!is_import) {
        s += cat(" = ", InitExp(g->init_expr));
      }
      s += ";\n";
      global_index++;
    }
    if (!mc.module.globals.empty())
      s += "\n";

    // Tables.
    Index table_index = 0;
    for (auto tab : mc.module.tables) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Table, table_index, tab->name);
      s += cat("table ", tab->name, ":", GetDecompTypeName(tab->elem_type));
      if (!is_import) {
        s += cat("(min: ", std::to_string(tab->elem_limits.initial),
                 ", max: ", std::to_string(tab->elem_limits.max), ")");
      }
      s += ";\n";
      table_index++;
    }
    if (!mc.module.tables.empty())
      s += "\n";

    // Data.
    for (auto dat : mc.module.data_segments) {
      s += cat("data ", dat->name, "(offset: ", InitExp(dat->offset), ") = ");
      auto ds = BinaryToString(dat->data);
      if (ds.size() > target_exp_width / 2) {
        s += "\n";
      }
      s += ds;
      s += ";\n";
    }
    if (!mc.module.data_segments.empty())
      s += "\n";

    // Code.
    Index func_index = 0;
    for (auto f : mc.module.funcs) {
      cur_func = f;
      auto is_import =
          CheckImportExport(s, ExternalKind::Func, func_index, f->name);
      AST ast(mc, f);
      cur_ast = &ast;
      if (!is_import) {
        ast.Construct(f->exprs, f->GetNumResults(), true);
        lst.Track(ast.exp_stack[0]);
        lst.CheckLayouts();
      }
      s += cat("function ", f->name, "(");
      for (Index i = 0; i < f->GetNumParams(); i++) {
        if (i)
          s += ", ";
        auto t = f->GetParamType(i);
        auto name = "$" + IndexToAlphaName(i);
        s += LocalDecl(name, t);
      }
      s += ")";
      if (f->GetNumResults()) {
        if (f->GetNumResults() == 1) {
          s += cat(":", GetDecompTypeName(f->GetResultType(0)));
        } else {
          s += ":(";
          for (Index i = 0; i < f->GetNumResults(); i++) {
            if (i)
              s += ", ";
            s += GetDecompTypeName(f->GetResultType(i));
          }
          s += ")";
        }
      }
      if (is_import) {
        s += ";";
      } else {
        s += " {\n";
        auto val = DecompileExpr(ast.exp_stack[0], nullptr);
        IndentValue(val, indent_amount, {});
        for (auto& stat : val.v) {
          s += stat;
          s += "\n";
        }
        s += "}";
      }
      s += "\n\n";
      mc.EndFunc();
      lst.Clear();
      func_index++;
      cur_ast = nullptr;
      cur_func = nullptr;
    }
    return s;
  }